

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

void obj_dosettracing(t_object *ob,int onoff)

{
  _outlet *p_Var1;
  t_pd *fatso;
  t_backtracer *ptVar2;
  _outconnect *p_Var3;
  t_backtracer *b;
  _outlet **pp_Var4;
  
  pp_Var4 = &ob->te_outlet;
  while (p_Var1 = *pp_Var4, p_Var1 != (_outlet *)0x0) {
    if (onoff == 0) {
      p_Var3 = p_Var1->o_connections;
      if ((p_Var3 == (_outconnect *)0x0) || (fatso = p_Var3->oc_to, *fatso != backtracer_class)) {
        bug("obj_dosettracing");
      }
      else {
        freebytes(p_Var3,0x10);
        p_Var1->o_connections = (_outconnect *)fatso[1];
        freebytes(fatso,0x18);
      }
    }
    else {
      ptVar2 = backtracer_new((t_pd *)ob);
      ptVar2->b_connections = p_Var1->o_connections;
      p_Var3 = (_outconnect *)getbytes(0x10);
      p_Var1->o_connections = p_Var3;
      p_Var3->oc_next = (_outconnect *)0x0;
      p_Var3->oc_to = &ptVar2->b_pd;
    }
    pp_Var4 = &p_Var1->o_next;
  }
  return;
}

Assistant:

void obj_dosettracing(t_object *ob, int onoff)
{
    t_outlet *o;
    for (o = ob->ob_outlet; o; o = o->o_next)
    {
        if (onoff)
        {
            t_backtracer *b = backtracer_new(&ob->ob_pd);
            b->b_connections = o->o_connections;
            o->o_connections =  (t_outconnect *)t_getbytes(sizeof(t_outconnect));
            o->o_connections->oc_next = 0;
            o->o_connections->oc_to = &b->b_pd;
        }
        else if (o->o_connections &&
            (*o->o_connections->oc_to == backtracer_class))
        {
            t_backtracer *b = (t_backtracer *)o->o_connections->oc_to;
            t_freebytes(o->o_connections, sizeof(*o->o_connections));
            o->o_connections = b->b_connections;
            t_freebytes(b, sizeof(*b));
        }
        else bug("obj_dosettracing");
    }
}